

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_device.cpp
# Opt level: O3

void __thiscall
booster::aio::basic_io_device::set_non_blocking
          (basic_io_device *this,bool nonblocking,error_code *e)

{
  error_category *peVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  
  uVar2 = fcntl(this->fd_,3,0);
  if ((int)uVar2 < 0) {
    piVar5 = __errno_location();
    peVar1 = syscat;
    e->_M_value = *piVar5;
    e->_M_cat = peVar1;
  }
  else {
    uVar3 = uVar2 & 0x7ffff7ff;
    if (nonblocking) {
      uVar3 = uVar2 | 0x800;
    }
    iVar4 = fcntl(this->fd_,4,(ulong)uVar3);
    if (iVar4 < 0) {
      piVar5 = __errno_location();
      peVar1 = syscat;
      e->_M_value = *piVar5;
      e->_M_cat = peVar1;
    }
    this->nonblocking_was_set_ = nonblocking;
  }
  return;
}

Assistant:

void basic_io_device::set_non_blocking(bool nonblocking,system::error_code &e)
{
	#if defined BOOSTER_WIN32
	unsigned long opt =  nonblocking;
	if(::ioctlsocket(fd_,FIONBIO,&opt) < 0)
		e=geterror();
	#elif ! defined(O_NONBLOCK)
	int opt = nonblocking;
	if(::ioctl(fd_,FIONBIO,&opt) < 0)
		e=geterror();
	#else 
	int flags = ::fcntl(fd_,F_GETFL,0);
	if(flags < 0) {
		e=geterror();
		return;
	}
	if(nonblocking)
		flags = flags | O_NONBLOCK;
	else
		flags = flags & ~O_NONBLOCK;

	if(::fcntl(fd_,F_SETFL,flags) < 0)
		e=geterror();
	#endif
	nonblocking_was_set_=nonblocking;
}